

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> * __thiscall
cfd::core::TapBranch::GetNodeList
          (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           *__return_storage_ptr__,TapBranch *this)

{
  bool bVar1;
  ByteData256 local_58;
  reference local_40;
  TapBranch *branch;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *__range2;
  TapBranch *this_local;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *list;
  
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (__return_storage_ptr__);
  __end2 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::begin
                     (&this->branch_list_);
  branch = (TapBranch *)
           ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::end
                     (&this->branch_list_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                                     *)&branch), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
               ::operator*(&__end2);
    GetCurrentBranchHash(&local_58,local_40);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(__return_storage_ptr__,&local_58);
    ByteData256::~ByteData256(&local_58);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData256> TapBranch::GetNodeList() const {
  std::vector<ByteData256> list;
  for (const auto& branch : branch_list_) {
    list.emplace_back(branch.GetCurrentBranchHash());
  }
  return list;
}